

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example1_fib.cpp
# Opt level: O0

int main(void)

{
  _Ios_Openmode _Var1;
  size_t sVar2;
  size_t sVar3;
  uchar *puVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_670;
  char local_658 [8];
  ofstream file;
  undefined1 local_458 [8];
  ByteCode bc;
  string local_438;
  allocator<char> local_411;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  int local_3c4;
  variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3c0;
  allocator<char> local_391;
  string local_390;
  int local_36c;
  variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_368;
  int local_33c;
  variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_338;
  size_t local_310;
  size_t if2;
  variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_300;
  int local_2d4;
  variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d0;
  size_t local_2a8;
  size_t if1;
  variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_298;
  allocator<char> local_269;
  string local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  vector<ag::Type,_std::allocator<ag::Type>_> local_228;
  allocator<char> local_209;
  string local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  vector<ag::Type,_std::allocator<ag::Type>_> local_1c8;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  size_t local_160;
  size_t nid;
  undefined1 local_148 [8];
  Generator gen;
  
  gen.m_consts.
  super__Vector_base<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  ag::Generator::Generator((Generator *)local_148);
  ag::Generator::SetHeader((Generator *)local_148,'\x01',0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"a",&local_181);
  sVar2 = ag::Generator::AddGlobal((Generator *)local_148,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  local_160 = sVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"main",&local_1a9);
  local_1c8.super__Vector_base<ag::Type,_std::allocator<ag::Type>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1c8.super__Vector_base<ag::Type,_std::allocator<ag::Type>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<ag::Type,_std::allocator<ag::Type>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<ag::Type,_std::allocator<ag::Type>_>::vector(&local_1c8);
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1e8);
  ag::Generator::FunctionManager::Create
            ((FunctionManager *)local_148,&local_1a8,'\0',&local_1c8,&local_1e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
  std::vector<ag::Type,_std::allocator<ag::Type>_>::~vector(&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"fib",&local_209);
  local_228.super__Vector_base<ag::Type,_std::allocator<ag::Type>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_228.super__Vector_base<ag::Type,_std::allocator<ag::Type>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_228.super__Vector_base<ag::Type,_std::allocator<ag::Type>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<ag::Type,_std::allocator<ag::Type>_>::vector(&local_228);
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_248);
  ag::Generator::FunctionManager::Create
            ((FunctionManager *)local_148,&local_208,'\x01',&local_228,&local_248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_248);
  std::vector<ag::Type,_std::allocator<ag::Type>_>::~vector(&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"fib",&local_269);
  ag::Generator::FunctionManager::SetCurrent((FunctionManager *)local_148,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  if1._4_4_ = 0;
  std::variant<char,unsigned_int,int,float,std::__cxx11::string>::variant<int,void,void,int,void>
            ((variant<char,unsigned_int,int,float,std::__cxx11::string> *)&local_298,
             (int *)((long)&if1 + 4));
  ag::Generator::FunctionManager::PushStack((FunctionManager *)local_148,(agvariant *)&local_298);
  std::
  variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~variant(&local_298);
  ag::Generator::FunctionManager::GetArgumentPointer((FunctionManager *)local_148,0);
  ag::Generator::FunctionManager::Equal((FunctionManager *)local_148);
  local_2a8 = ag::Generator::FunctionManager::If((FunctionManager *)local_148);
  local_2d4 = 0;
  std::variant<char,unsigned_int,int,float,std::__cxx11::string>::variant<int,void,void,int,void>
            ((variant<char,unsigned_int,int,float,std::__cxx11::string> *)&local_2d0,&local_2d4);
  ag::Generator::FunctionManager::PushStack((FunctionManager *)local_148,(agvariant *)&local_2d0);
  std::
  variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~variant(&local_2d0);
  ag::Generator::FunctionManager::Return((FunctionManager *)local_148);
  sVar2 = local_2a8;
  sVar3 = ag::Generator::FunctionManager::GetCurrentAddress((FunctionManager *)local_148);
  ag::Generator::FunctionManager::SetAddress((FunctionManager *)local_148,sVar2,sVar3);
  if2._4_4_ = 1;
  std::variant<char,unsigned_int,int,float,std::__cxx11::string>::variant<int,void,void,int,void>
            ((variant<char,unsigned_int,int,float,std::__cxx11::string> *)&local_300,
             (int *)((long)&if2 + 4));
  ag::Generator::FunctionManager::PushStack((FunctionManager *)local_148,(agvariant *)&local_300);
  std::
  variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~variant(&local_300);
  ag::Generator::FunctionManager::GetArgumentPointer((FunctionManager *)local_148,0);
  ag::Generator::FunctionManager::Equal((FunctionManager *)local_148);
  local_310 = ag::Generator::FunctionManager::If((FunctionManager *)local_148);
  local_33c = 1;
  std::variant<char,unsigned_int,int,float,std::__cxx11::string>::variant<int,void,void,int,void>
            ((variant<char,unsigned_int,int,float,std::__cxx11::string> *)&local_338,&local_33c);
  ag::Generator::FunctionManager::PushStack((FunctionManager *)local_148,(agvariant *)&local_338);
  std::
  variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~variant(&local_338);
  ag::Generator::FunctionManager::Return((FunctionManager *)local_148);
  sVar2 = local_310;
  sVar3 = ag::Generator::FunctionManager::GetCurrentAddress((FunctionManager *)local_148);
  ag::Generator::FunctionManager::SetAddress((FunctionManager *)local_148,sVar2,sVar3);
  ag::Generator::FunctionManager::GetArgumentPointer((FunctionManager *)local_148,0);
  local_36c = 1;
  std::variant<char,unsigned_int,int,float,std::__cxx11::string>::variant<int,void,void,int,void>
            ((variant<char,unsigned_int,int,float,std::__cxx11::string> *)&local_368,&local_36c);
  ag::Generator::FunctionManager::PushStack((FunctionManager *)local_148,(agvariant *)&local_368);
  std::
  variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~variant(&local_368);
  ag::Generator::FunctionManager::Subtract((FunctionManager *)local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"fib",&local_391);
  ag::Generator::FunctionManager::CallReturn((FunctionManager *)local_148,&local_390,'\x01');
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator(&local_391);
  ag::Generator::FunctionManager::GetArgumentPointer((FunctionManager *)local_148,0);
  local_3c4 = 2;
  std::variant<char,unsigned_int,int,float,std::__cxx11::string>::variant<int,void,void,int,void>
            ((variant<char,unsigned_int,int,float,std::__cxx11::string> *)&local_3c0,&local_3c4);
  ag::Generator::FunctionManager::PushStack((FunctionManager *)local_148,(agvariant *)&local_3c0);
  std::
  variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~variant(&local_3c0);
  ag::Generator::FunctionManager::Subtract((FunctionManager *)local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"fib",&local_3e9);
  ag::Generator::FunctionManager::CallReturn((FunctionManager *)local_148,&local_3e8,'\x01');
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  ag::Generator::FunctionManager::Add((FunctionManager *)local_148);
  ag::Generator::FunctionManager::Return((FunctionManager *)local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"main",&local_411);
  ag::Generator::FunctionManager::SetCurrent((FunctionManager *)local_148,&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator(&local_411);
  ag::Generator::FunctionManager::GetGlobal((FunctionManager *)local_148,(uint16_t)local_160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,"fib",
             (allocator<char> *)
             ((long)&bc.m_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  ag::Generator::FunctionManager::CallReturn((FunctionManager *)local_148,&local_438,'\x01');
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&bc.m_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  ag::Generator::FunctionManager::Return((FunctionManager *)local_148);
  ag::Generator::Get((ByteCode *)local_458,(Generator *)local_148);
  _Var1 = std::operator|(_S_out,_S_bin);
  std::ofstream::ofstream(local_658,"fib.bv",_Var1);
  ag::ByteCode::Get(&local_670,(ByteCode *)local_458);
  puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&local_670);
  ag::ByteCode::Count((ByteCode *)local_458);
  std::ostream::write(local_658,(long)puVar4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_670);
  gen.m_consts.
  super__Vector_base<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::ofstream::~ofstream(local_658);
  ag::ByteCode::~ByteCode((ByteCode *)local_458);
  ag::Generator::~Generator((Generator *)local_148);
  return gen.m_consts.
         super__Vector_base<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main() {
	ag::Generator gen;

	// header - version
	gen.SetHeader(1, 0);

	size_t nid = gen.AddGlobal("a");

	gen.Function.Create("main");	// define main()
	gen.Function.Create("fib", 1);	// define fib(a)

	gen.Function.SetCurrent("fib");
		gen.Function.PushStack(0);			// 0
		gen.Function.GetArgumentPointer(0);	// arg0 0
		gen.Function.Equal();				// arg0 == 0
		size_t if1 = gen.Function.If();		// if (arg0 == 0)
			gen.Function.PushStack(0);		// 0
			gen.Function.Return();			// return 0;
		gen.Function.SetAddress(if1, gen.Function.GetCurrentAddress());

		gen.Function.PushStack(1);			// 1
		gen.Function.GetArgumentPointer(0);	// arg0 1
		gen.Function.Equal();				// arg0 == 1
		size_t if2 = gen.Function.If();		// if (arg0 == 1)
			gen.Function.PushStack(1);		// 1
			gen.Function.Return();			// return 1;
		gen.Function.SetAddress(if2, gen.Function.GetCurrentAddress());

		gen.Function.GetArgumentPointer(0);	// &arg0
		gen.Function.PushStack(1);			// 1 arg0
		gen.Function.Subtract();			// arg0 - 1
		gen.Function.CallReturn("fib", 1);	// fib(arg0 - 1)

		gen.Function.GetArgumentPointer(0);	// &arg0 fib(arg0 - 1)
		gen.Function.PushStack(2);			// 2 arg0 fib(arg0 - 1)
		gen.Function.Subtract();			// arg0-2 fib(arg0 - 1)
		gen.Function.CallReturn("fib", 1);	// fib(arg0 - 2) fib(arg0 - 1)

		gen.Function.Add();					// fib(arg0 - 1) + fib(arg0 - 2)

		gen.Function.Return();				// return fib(arg0 - 1) + fiv(arg0 - 2);

	gen.Function.SetCurrent("main");
		gen.Function.GetGlobal(nid);		// a
		gen.Function.CallReturn("fib", 1);	// fib(a)
		gen.Function.Return();				// return fib(a)

	ag::ByteCode bc = gen.Get();	// get bytecode

	std::ofstream file("fib.bv", std::ios::out | std::ios::binary);
	file.write(reinterpret_cast<const char *>(bc.Get().data()), bc.Count());

	return 0;
}